

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

QStringList * __thiscall
QTextEditMimeData::formats(QStringList *__return_storage_ptr__,QTextEditMimeData *this)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  QStringList *ret;
  int i;
  long lVar4;
  long in_FS_OFFSET;
  QLatin1String local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = QTextDocumentFragment::isEmpty();
  if (cVar2 == '\0') {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
    QList<QString>::reserve(__return_storage_ptr__,4);
    lVar4 = 0;
    do {
      uVar3 = (ulong)supportedMimeTypes.m_offsets._M_elems[lVar4];
      local_38.m_data = supportedMimeTypes.m_string._M_elems + uVar3;
      local_38.m_size = -1;
      do {
        pcVar1 = (char *)(uVar3 + 0x6f1e21 + local_38.m_size);
        local_38.m_size = local_38.m_size + 1;
      } while (*pcVar1 != '\0');
      QtPrivate::QMovableArrayOps<QString>::emplace<QLatin1String>
                ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_38);
      QList<QString>::end(__return_storage_ptr__);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_004d2246;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_004d2246:
      __stack_chk_fail();
    }
    QMimeData::formats();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QTextEditMimeData::formats() const
{
    if (!fragment.isEmpty()) {
        constexpr auto size = supportedMimeTypes.count();
        QStringList ret;
        ret.reserve(size);
        for (int i = 0; i < size; ++i)
            ret.emplace_back(QLatin1StringView(supportedMimeTypes.at(i)));

        return ret;
    }

    return QMimeData::formats();
}